

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O1

void __thiscall Animation_Constraint::Update(Animation_Constraint *this)

{
  Am_Object_Advanced *this_00;
  Animation_Constraint *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Am_Value *pAVar5;
  Am_Value_List targets;
  Am_Value_List starts;
  Am_Value t;
  Am_Value s;
  Am_Object local_90;
  Am_Object local_88;
  Am_Value_List local_80;
  Am_Value_List local_70;
  Am_Object_Advanced *local_60;
  Animation_Constraint *local_58;
  Am_Value local_50;
  Am_Value local_40;
  
  if (this->change_enqueued == true) {
    this->change_enqueued = false;
    this_00 = &this->interpolator;
    pAVar5 = Am_Object::Get(&this_00->super_Am_Object,0xf7,0);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar5);
    if (bVar2) {
      if (this->must_abort_animation != true) {
        Am_Interrupt_Animator(&this_00->super_Am_Object,&this->target);
        return;
      }
      this->must_abort_animation = false;
      Am_Object::Am_Object(&local_88,&this_00->super_Am_Object);
      Am_Abort_Animator(&local_88);
      Am_Object::~Am_Object(&local_88);
    }
    local_60 = this_00;
    local_58 = this;
    if (this->multi_slot == false) {
      bVar2 = Am_Value::operator!=(&this->start,&this->target);
      bVar4 = Am_Value::Exists(&this->start);
      if (bVar4) {
        bVar4 = Am_Value::Exists(&this->target);
      }
      else {
        bVar4 = false;
      }
    }
    else {
      Am_Value_List::Am_Value_List(&local_70,&this->start);
      Am_Value_List::Am_Value_List(&local_80,&this->target);
      Am_Value_List::Start(&local_70);
      Am_Value_List::Start(&local_80);
      bVar4 = true;
      bVar2 = false;
      while( true ) {
        bVar3 = Am_Value_List::Last(&local_70);
        if (bVar3) break;
        bVar3 = Am_Value_List::Last(&local_80);
        if (bVar3) break;
        pAVar5 = Am_Value_List::Get(&local_70);
        Am_Value::Am_Value(&local_40,pAVar5);
        pAVar5 = Am_Value_List::Get(&local_80);
        Am_Value::Am_Value(&local_50,pAVar5);
        bVar3 = Am_Value::Exists(&local_40);
        if (bVar3) {
          bVar3 = Am_Value::Exists(&local_50);
          if (!bVar3) goto LAB_0019a8e9;
        }
        else {
LAB_0019a8e9:
          bVar4 = false;
        }
        bVar3 = Am_Value::operator!=(&local_40,&local_50);
        Am_Value::~Am_Value(&local_50);
        Am_Value::~Am_Value(&local_40);
        Am_Value_List::Next(&local_70);
        if (bVar3) {
          bVar2 = true;
        }
        Am_Value_List::Next(&local_80);
      }
      Am_Value_List::~Am_Value_List(&local_80);
      Am_Value_List::~Am_Value_List(&local_70);
    }
    pAVar1 = local_58;
    if ((bVar2 & bVar4) != 0) {
      Am_Object::Am_Object(&local_90,&local_60->super_Am_Object);
      Am_Start_Animator(&local_90,&pAVar1->start,&pAVar1->target);
      Am_Object::~Am_Object(&local_90);
    }
  }
  return;
}

Assistant:

void
Animation_Constraint::Update()
{
  // std::cout << "Animation_Constraint::Update" <<std::endl;

  if (change_enqueued) {
    change_enqueued = false;

    bool running = interpolator.Get(Am_RUNNING);

    if (running) {
      if (must_abort_animation) {
        must_abort_animation = false;
        Am_Abort_Animator(interpolator);
      } else {
        Am_Interrupt_Animator(interpolator, target);
        return;
      }
    }

    // Decide whether to start the animation.
    // Do so only if at least one slot's target is different from its start,
    // and all slots have initialized starts and targets
    bool different;
    bool initialized;
    if (!multi_slot) {
      different = (start != target);
      initialized = start.Exists() && target.Exists();
    } else {
      Am_Value_List starts = start;
      Am_Value_List targets = target;

      different = false;
      initialized = true;

      for (starts.Start(), targets.Start(); !starts.Last() && !targets.Last();
           starts.Next(), targets.Next()) {
        Am_Value s = starts.Get();
        Am_Value t = targets.Get();

        if (!s.Exists() || !t.Exists())
          initialized = false;

        if (s != t)
          different = true;
      }
    }

    if (different && initialized)
      Am_Start_Animator(interpolator, start, target);
  }
}